

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

bool __thiscall wasm::I64ToI32Lowering::hasOutParam(I64ToI32Lowering *this,Expression *e)

{
  bool bVar1;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_false>
  local_28;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_false>
  local_20;
  Expression *local_18;
  Expression *e_local;
  I64ToI32Lowering *this_local;
  
  local_18 = e;
  e_local = (Expression *)this;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Expression_*,_wasm::I64ToI32Lowering::TempVar,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>_>
       ::find(&this->highBitVars,&local_18);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Expression_*,_wasm::I64ToI32Lowering::TempVar,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>_>
       ::end(&this->highBitVars);
  bVar1 = std::__detail::operator!=(&local_20,&local_28);
  return bVar1;
}

Assistant:

bool hasOutParam(Expression* e) {
    return highBitVars.find(e) != highBitVars.end();
  }